

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int intra_block_yrd(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int *bmode_costs,int64_t *best_rd,
                   int *rate,int *rate_tokenonly,int64_t *distortion,uint8_t *skippable,
                   MB_MODE_INFO *best_mbmi,PICK_MODE_CONTEXT *ctx)

{
  BLOCK_SIZE *__src;
  long lVar1;
  int iVar2;
  int iVar3;
  long ref_best_rd_00;
  long lVar4;
  MACROBLOCK *in_RCX;
  undefined1 in_DL;
  long in_RSI;
  MB_MODE_INFO *in_RDI;
  RD_STATS *in_R8;
  int *in_R9;
  AV1_COMP *unaff_retaddr;
  int *in_stack_00000008;
  int64_t this_rd;
  int this_rate;
  int this_rate_tokenonly;
  int64_t ref_best_rd;
  RD_STATS rd_stats;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MACROBLOCK *local_90;
  int local_70;
  long local_68;
  undefined1 local_50;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar5;
  
  iVar5 = CONCAT13(in_DL,in_stack_ffffffffffffffe4);
  ref_best_rd_00 = in_RSI + 0x1a0;
  __src = (BLOCK_SIZE *)**(undefined8 **)(in_RSI + 0x2058);
  if ((*(byte *)((long)in_RDI[0x8cb].palette_mode_info.palette_colors + 0x27) & 1) == 0) {
    local_90 = (MACROBLOCK *)0x7fffffffffffffff;
  }
  else {
    local_90 = *(MACROBLOCK **)in_R8;
  }
  av1_pick_uniform_tx_size_type_yrd
            ((AV1_COMP *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),in_RCX,in_R8,
             (BLOCK_SIZE)((ulong)in_R9 >> 0x38),ref_best_rd_00);
  if (local_70 == 0x7fffffff) {
    iVar5 = 0;
  }
  else {
    iVar3 = local_70;
    if (*(int *)(ref_best_rd_00 + 0x29c4 + (ulong)((byte)*(undefined2 *)(__src + 0xa7) & 7) * 4) ==
        0) {
      iVar2 = block_signals_txsize(*__src);
      if (iVar2 != 0) {
        iVar2 = tx_size_cost(local_90,(BLOCK_SIZE)((uint)iVar3 >> 0x18),
                             (TX_SIZE)((uint)iVar3 >> 0x10));
        iVar3 = iVar3 - iVar2;
      }
    }
    iVar5 = intra_mode_info_cost_y
                      (unaff_retaddr,
                       (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(BLOCK_SIZE)((ulong)in_RSI >> 0x38),(int)in_RSI,iVar5);
    lVar4 = ((long)(local_70 + iVar5) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
            local_68 * 0x80;
    lVar1._0_4_ = in_R8->rate;
    lVar1._4_4_ = in_R8->zero_rate;
    if (lVar4 < lVar1) {
      memcpy((void *)ref_best_rd,__src,0xb0);
      *(long *)in_R8 = lVar4;
      *in_R9 = local_70 + iVar5;
      *in_stack_00000008 = iVar3;
      *(long *)this_rd = local_68;
      *_this_rate = local_50;
      memcpy(*(void **)(rd_stats._0_8_ + 0x118),(void *)(in_RSI + 0x24e09),
             (long)*(int *)(rd_stats._0_8_ + 0x1a0));
      memcpy(*(void **)(rd_stats._0_8_ + 0x198),*(void **)(ref_best_rd_00 + 0x1ee8),
             (long)*(int *)(rd_stats._0_8_ + 0x1a0));
      iVar5 = 1;
    }
    else {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static inline int intra_block_yrd(const AV1_COMP *const cpi, MACROBLOCK *x,
                                  BLOCK_SIZE bsize, const int *bmode_costs,
                                  int64_t *best_rd, int *rate,
                                  int *rate_tokenonly, int64_t *distortion,
                                  uint8_t *skippable, MB_MODE_INFO *best_mbmi,
                                  PICK_MODE_CONTEXT *ctx) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  RD_STATS rd_stats;
  // In order to improve txfm search, avoid rd based breakouts during winner
  // mode evaluation. Hence passing ref_best_rd as INT64_MAX by default when the
  // speed feature use_rd_based_breakout_for_intra_tx_search is disabled.
  int64_t ref_best_rd = cpi->sf.tx_sf.use_rd_based_breakout_for_intra_tx_search
                            ? *best_rd
                            : INT64_MAX;
  av1_pick_uniform_tx_size_type_yrd(cpi, x, &rd_stats, bsize, ref_best_rd);
  if (rd_stats.rate == INT_MAX) return 0;
  int this_rate_tokenonly = rd_stats.rate;
  if (!xd->lossless[mbmi->segment_id] && block_signals_txsize(mbmi->bsize)) {
    // av1_pick_uniform_tx_size_type_yrd above includes the cost of the tx_size
    // in the tokenonly rate, but for intra blocks, tx_size is always coded
    // (prediction granularity), so we account for it in the full rate,
    // not the tokenonly rate.
    this_rate_tokenonly -= tx_size_cost(x, bsize, mbmi->tx_size);
  }
  const int this_rate =
      rd_stats.rate +
      intra_mode_info_cost_y(cpi, x, mbmi, bsize, bmode_costs[mbmi->mode], 0);
  const int64_t this_rd = RDCOST(x->rdmult, this_rate, rd_stats.dist);
  if (this_rd < *best_rd) {
    *best_mbmi = *mbmi;
    *best_rd = this_rd;
    *rate = this_rate;
    *rate_tokenonly = this_rate_tokenonly;
    *distortion = rd_stats.dist;
    *skippable = rd_stats.skip_txfm;
    av1_copy_array(ctx->blk_skip, x->txfm_search_info.blk_skip,
                   ctx->num_4x4_blk);
    av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    return 1;
  }
  return 0;
}